

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O2

void HU_DrawScores(player_t *player)

{
  TObjPtr<AActor> *obj;
  player_t *player_00;
  int height;
  FTeam *pFVar1;
  FFont *pFVar2;
  DFrameBuffer *pDVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  AActor *pAVar10;
  long lVar11;
  FIntCVar *pFVar12;
  BYTE *string;
  BYTE *string_00;
  BYTE *string_01;
  int *piVar13;
  FTexture *pFVar14;
  int iVar15;
  code *__compar;
  FIntCVar *pFVar16;
  char *pcVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  userinfo_t *this;
  ulong uVar23;
  int iVar24;
  FString FVar25;
  bool bVar26;
  undefined8 in_stack_fffffffffffffe80;
  undefined4 uVar27;
  ulong in_stack_fffffffffffffe88;
  char *local_110;
  uint local_104;
  int local_100;
  int local_fc;
  int maxscorewidth;
  int maxnamewidth;
  FString local_f0;
  FString local_e8;
  ulong local_e0;
  ulong local_d8;
  int maxiconheight;
  player_t *sortedplayers [8];
  char str [80];
  
  if (deathmatch.Value == 0) {
    if (!sb_cooperative_enable.Value) {
      return;
    }
    if (!multiplayer) {
      return;
    }
  }
  else if (teamplay.Value) {
    if (!sb_teamdeathmatch_enable.Value) {
      return;
    }
  }
  else if (!sb_deathmatch_enable.Value) {
    return;
  }
  obj = &player->camera;
  pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
  if ((pAVar10 != (AActor *)0x0) &&
     (pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar10->player != (player_t *)0x0)) {
    pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
    player = pAVar10->player;
  }
  iVar15 = 0;
  for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
    sortedplayers[lVar11] =
         (player_t *)
         (&players +
         (long)(int)(iVar15 + (uint)((player_t *)(&players + (long)iVar15 * 0x54) == player)) * 0x54
         );
    iVar15 = iVar15 + (uint)((player_t *)(&players + (long)iVar15 * 0x54) == player) + 1;
  }
  __compar = compareteams;
  if (deathmatch.Value == 0) {
    __compar = comparepoints;
  }
  if (teamplay.Value == false) {
    __compar = comparepoints;
  }
  sortedplayers[7] = player;
  qsort(sortedplayers,8,8,__compar);
  pFVar16 = &sb_deathmatch_headingcolor;
  if ((teamplay.Value & 1U) != 0) {
    pFVar16 = &sb_teamdeathmatch_headingcolor;
  }
  pFVar12 = &sb_cooperative_headingcolor;
  if (deathmatch.Value != 0) {
    pFVar12 = pFVar16;
  }
  iVar15 = pFVar12->Value;
  HU_GetPlayerWidths(&maxnamewidth,&maxscorewidth,&maxiconheight);
  uVar27 = (undefined4)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  uVar6 = (uint)(in_stack_fffffffffffffe88 >> 0x20);
  iVar22 = SmallFont->FontHeight * CleanYfac;
  height = maxiconheight * CleanYfac;
  if (maxiconheight * CleanYfac < iVar22) {
    height = iVar22;
  }
  local_d8 = (long)((height - iVar22) + 1) / 2 & 0xffffffff;
  iVar4 = (ST_Y + (CleanYfac + iVar22) * -8 + -8) / 2;
  if (iVar4 < CleanYfac * 0x30) {
    iVar4 = CleanYfac * 0x30;
  }
  local_e8.Chars = (char *)(ulong)(uint)(ST_Y - iVar22);
  local_f0.Chars = (char *)player;
  if (deathmatch.Value != 0) {
    bVar26 = true;
    if (((timelimit.Value != 0.0) || (NAN(timelimit.Value))) && (gamestate == GS_LEVEL)) {
      uVar21 = (int)(timelimit.Value * 35.0 * 60.0) - level.maptime;
      uVar20 = 0;
      if (0 < (int)uVar21) {
        uVar20 = (ulong)uVar21;
      }
      iVar18 = (int)(uVar20 / 0x1ec30) * -0x1ec30 + (int)uVar20;
      uVar23 = (long)iVar18 / 0x834;
      uVar19 = uVar23 & 0xffffffff;
      uVar23 = (long)((int)uVar23 * -0x834 + iVar18) / 0x23 & 0xffffffff;
      if ((int)uVar21 < 0x1ec30) {
        mysnprintf(str,0x50,"Level ends in %d:%02d",uVar19,uVar23);
      }
      else {
        mysnprintf(str,0x50,"Level ends in %d:%02d:%02d",uVar20 / 0x1ec30,uVar19,uVar23);
      }
      pDVar3 = screen;
      pFVar2 = SmallFont;
      iVar18 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar5 = FFont::StringWidth(SmallFont,(BYTE *)str);
      in_stack_fffffffffffffe88 = (ulong)uVar6 << 0x20;
      in_stack_fffffffffffffe80 = CONCAT44(uVar27,1);
      DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,2,iVar18 / 2 + (iVar5 / -2) * CleanXfac,
                        (int)local_e8.Chars,str,0x40001393,in_stack_fffffffffffffe80,
                        in_stack_fffffffffffffe88);
      bVar26 = deathmatch.Value != 0;
    }
    iVar18 = CleanYfac;
    pFVar1 = Teams.Array;
    uVar27 = (undefined4)((ulong)in_stack_fffffffffffffe80 >> 0x20);
    if ((teamplay.Value == true) && (bVar26)) {
      iVar5 = BigFont->FontHeight;
      uVar20 = (ulong)Teams.Count;
      for (lVar11 = 0; uVar20 * 0x38 - lVar11 != 0; lVar11 = lVar11 + 0x38) {
        *(undefined8 *)((long)&pFVar1->m_iPlayerCount + lVar11) = 0;
      }
      iVar24 = 0;
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
        if (playeringame[(long)(sortedplayers[lVar11][-0x3b4b].frags + 7) / 0x2a0] == true) {
          uVar6 = userinfo_t::GetTeam(&sortedplayers[lVar11]->userinfo);
          bVar26 = FTeam::IsValidTeam(&TeamLibrary,uVar6);
          if (bVar26) {
            iVar7 = userinfo_t::GetTeam(&sortedplayers[lVar11]->userinfo);
            iVar24 = iVar24 + (uint)(Teams.Array[iVar7].m_iPlayerCount == 0);
            Teams.Array[iVar7].m_iPlayerCount = Teams.Array[iVar7].m_iPlayerCount + 1;
            iVar7 = sortedplayers[lVar11]->fragcount;
            iVar8 = userinfo_t::GetTeam(&sortedplayers[lVar11]->userinfo);
            Teams.Array[iVar8].m_iScore = Teams.Array[iVar8].m_iScore + iVar7;
          }
        }
      }
      iVar7 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      uVar20 = (ulong)Teams.Count;
      iVar8 = 0;
      for (lVar11 = 0; uVar20 * 0x38 - lVar11 != 0; lVar11 = lVar11 + 0x38) {
        iVar8 = (iVar8 + 1) - (uint)(*(int *)((long)&(Teams.Array)->m_iPlayerCount + lVar11) == 0);
      }
      iVar9 = 8;
      if (8 < iVar24) {
        iVar9 = iVar24;
      }
      iVar4 = iVar4 - (iVar5 + 8) * iVar18;
      iVar9 = iVar7 / iVar9;
      uVar19 = (long)(iVar7 - (iVar8 + -1) * iVar9) / 2 & 0xffffffff;
      lVar11 = 0;
      for (uVar23 = 0; uVar27 = (undefined4)((ulong)in_stack_fffffffffffffe80 >> 0x20),
          uVar23 < uVar20; uVar23 = uVar23 + 1) {
        if (*(int *)((long)&(Teams.Array)->m_iPlayerCount + lVar11) != 0) {
          mysnprintf(str,0x50,"%d",(ulong)*(uint *)((long)&(Teams.Array)->m_iScore + lVar11));
          pDVar3 = screen;
          pFVar2 = BigFont;
          iVar18 = FTeam::GetTextColor((FTeam *)((long)&(Teams.Array)->m_iPlayerCount + lVar11));
          iVar5 = FFont::StringWidth(BigFont,(BYTE *)str);
          in_stack_fffffffffffffe88 = 0;
          in_stack_fffffffffffffe80 = 0;
          DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iVar18,(iVar5 * CleanXfac) / -2 + (int)uVar19,
                            iVar4,str,0x40001393,1,0);
          uVar19 = (ulong)(uint)((int)uVar19 + iVar9);
          uVar20 = (ulong)Teams.Count;
        }
        lVar11 = lVar11 + 0x38;
      }
      iVar4 = iVar4 + (BigFont->FontHeight + 8) * CleanYfac;
    }
  }
  string = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_COLOR");
  pcVar17 = "SCORE_FRAGS";
  if (deathmatch.Value == 0) {
    pcVar17 = "SCORE_KILLS";
  }
  string_00 = (BYTE *)FStringTable::operator()(&GStrings,pcVar17);
  pcVar17 = FStringTable::operator()(&GStrings,"SCORE_NAME");
  string_01 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_DELAY");
  iVar18 = FFont::StringWidth(SmallFont,string);
  iVar7 = (iVar18 + 8) * CleanXfac;
  iVar18 = FFont::StringWidth(SmallFont,string_00);
  iVar5 = (iVar18 + 8) * CleanXfac + iVar7;
  iVar8 = maxscorewidth * CleanXfac + iVar5;
  uVar6 = (maxnamewidth + 8) * CleanXfac + iVar8;
  iVar18 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  iVar24 = FFont::StringWidth(SmallFont,string_01);
  iVar18 = (iVar18 >> 1) - ((int)(iVar24 * CleanXfac + uVar6) >> 1);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar15,iVar18,iVar4,(char *)string,0x40001393,
                    CONCAT44(uVar27,1),in_stack_fffffffffffffe88 & 0xffffffff00000000);
  iVar7 = iVar7 + iVar18;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar15,iVar7,iVar4,(char *)string_00,0x40001393,1,0)
  ;
  local_fc = iVar8 + iVar18;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar15,local_fc,iVar4,pcVar17,0x40001393,1,0);
  local_100 = iVar18 + uVar6;
  local_e0 = (ulong)uVar6;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar15,local_100,iVar4,(char *)string_01,0x40001393,
                    1,0);
  iVar4 = iVar22 + CleanYfac * 6 + iVar4;
  local_104 = height + 2;
  uVar20 = 0;
  FVar25.Chars = local_f0.Chars;
  while ((uVar20 < 8 && (iVar4 <= (int)local_e8.Chars))) {
    player_00 = sortedplayers[uVar20];
    lVar11 = (long)(player_00[-0x3b4b].frags + 7) / 0x2a0;
    if (playeringame[lVar11] == true) {
      if (player_00 == (player_t *)FVar25.Chars) {
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                  (0x3e000000,screen,0xc8f5ff,(ulong)(uint)(CleanXfac * -0xc + iVar18),
                   (ulong)(iVar4 - 1),
                   (ulong)(uint)(CleanXfac * (maxnamewidth + 0x18) + (int)local_e0),(ulong)local_104
                  );
      }
      iVar15 = HU_GetRowColor(player_00,player_00 == (player_t *)FVar25.Chars);
      iVar22 = (int)lVar11;
      HU_DrawColorBar(iVar18,iVar4,height,iVar22);
      piVar13 = &player_00->fragcount;
      if (deathmatch.Value == 0) {
        piVar13 = &player_00->killcount;
      }
      mysnprintf(str,0x50,"%d",(ulong)(uint)*piVar13);
      iVar24 = iVar4 + (int)local_d8;
      pcVar17 = str;
      if (deathmatch.Value == 0) {
        pcVar17 = "DEAD";
      }
      if (player_00->playerstate != '\x01') {
        pcVar17 = str;
      }
      uVar23 = 0;
      uVar27 = 0;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar15,iVar7,iVar24,pcVar17,0x40001393,1,0);
      uVar6 = (player_00->mo->ScoreIcon).texnum;
      if (0 < (long)(int)uVar6) {
        if (uVar6 < TexMan.Textures.Count) {
          pFVar14 = TexMan.Textures.Array[(int)uVar6].Texture;
        }
        else {
          pFVar14 = (FTexture *)0x0;
        }
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFVar14,(double)(iVar5 + iVar18),(double)iVar4,0x40001393,1,0);
      }
      pDVar3 = screen;
      pFVar2 = SmallFont;
      this = &player_00->userinfo;
      pcVar17 = userinfo_t::GetName(this);
      DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iVar15,local_fc,iVar24,pcVar17,0x40001393,
                        CONCAT44(uVar27,1),uVar23 & 0xffffffff00000000);
      iVar8 = 0;
      for (lVar11 = 0; lVar11 != 0x24; lVar11 = lVar11 + 1) {
        iVar8 = iVar8 + netdelay[nodeforplayer[iVar22]][lVar11];
      }
      mysnprintf(str,0x50,"%d",(ulong)(uint)((iVar8 / 0x24) * ticdup * 0x1c));
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar15,local_100,iVar24,str,0x40001393,1,0);
      FVar25.Chars = local_f0.Chars;
      if (teamplay.Value != false) {
        userinfo_t::GetTeam(this);
        FTeam::GetLogo((FTeam *)&local_110);
        iVar15 = *(int *)(local_110 + -0xc);
        FString::~FString((FString *)&local_110);
        if (iVar15 != 0) {
          userinfo_t::GetTeam(this);
          FTeam::GetLogo((FTeam *)&local_110);
          pFVar14 = FTextureManager::operator[](&TexMan,local_110);
          FString::~FString((FString *)&local_110);
          pDVar3 = screen;
          iVar15 = FTexture::GetScaledWidth(pFVar14);
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar3,pFVar14,(double)(iVar18 - (iVar15 + 2) * CleanXfac),
                     (double)iVar4,0x40001393,1,0);
        }
      }
      iVar4 = iVar4 + height + CleanYfac;
    }
    uVar20 = uVar20 + 1;
  }
  V_SetBorderNeedRefresh();
  return;
}

Assistant:

void HU_DrawScores (player_t *player)
{
	if (deathmatch)
	{
		if (teamplay)
		{
			if (!sb_teamdeathmatch_enable)
				return;
		}
		else
		{
			if (!sb_deathmatch_enable)
				return;
		}
	}
	else
	{
		if (!sb_cooperative_enable || !multiplayer)
			return;
	}

	int i, j;
	player_t *sortedplayers[MAXPLAYERS];

	if (player->camera && player->camera->player)
		player = player->camera->player;

	sortedplayers[MAXPLAYERS-1] = player;
	for (i = 0, j = 0; j < MAXPLAYERS - 1; i++, j++)
	{
		if (&players[i] == player)
			i++;
		sortedplayers[j] = &players[i];
	}

	if (teamplay && deathmatch)
		qsort (sortedplayers, MAXPLAYERS, sizeof(player_t *), compareteams);
	else
		qsort (sortedplayers, MAXPLAYERS, sizeof(player_t *), comparepoints);

	HU_DoDrawScores (player, sortedplayers);

	V_SetBorderNeedRefresh();
}